

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitBrOn
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,BrOn *curr)

{
  string_view sVar1;
  bool bVar2;
  Literal *pLVar3;
  Literal local_108;
  Literal local_f0;
  Literal local_d8;
  Literal local_c0;
  Literal local_a8;
  Literal local_90;
  undefined1 local_78 [8];
  Flow flow;
  
  if ((curr->op & ~BrOnNonNull) == BrOnCast) {
    doCast<wasm::BrOn>((Cast *)local_78,this,curr);
    if ((char)flow.breakTo.super_IString.str._M_str == '\x02') {
      if (curr->op == BrOnCast) {
        Literal::Literal(&local_108,(Literal *)local_78);
        Flow::Flow(__return_storage_ptr__,&local_108);
        pLVar3 = &local_108;
      }
      else {
        sVar1 = (curr->name).super_IString.str;
        Literal::Literal(&local_f0,(Literal *)local_78);
        Flow::Flow(__return_storage_ptr__,(Name)sVar1,&local_f0);
        pLVar3 = &local_f0;
      }
    }
    else {
      if ((char)flow.breakTo.super_IString.str._M_str != '\x01') {
        if ((char)flow.breakTo.super_IString.str._M_str != '\0') {
          __assert_fail("result",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                        ,0x5d8,
                        "Flow wasm::ExpressionRunner<wasm::ModuleRunner>::visitBrOn(BrOn *) [SubType = wasm::ModuleRunner]"
                       );
        }
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
             (size_t)local_78;
        Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.
                         fixed._M_elems,(Literal *)&flow);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::vector
                  (&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible,
                   (vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                   &flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
        (__return_storage_ptr__->breakTo).super_IString.str._M_len =
             CONCAT44(flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_,
                      flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._0_4_);
        (__return_storage_ptr__->breakTo).super_IString.str._M_str =
             (char *)CONCAT44(flow.breakTo.super_IString.str._M_len._4_4_,
                              (undefined4)flow.breakTo.super_IString.str._M_len);
        goto LAB_005fbdd3;
      }
      if (curr->op == BrOnCast) {
        sVar1 = (curr->name).super_IString.str;
        Literal::Literal(&local_d8,(Literal *)local_78);
        Flow::Flow(__return_storage_ptr__,(Name)sVar1,&local_d8);
        pLVar3 = &local_d8;
      }
      else {
        Literal::Literal(&local_c0,(Literal *)local_78);
        Flow::Flow(__return_storage_ptr__,&local_c0);
        pLVar3 = &local_c0;
      }
    }
    Literal::~Literal(pLVar3);
LAB_005fbdd3:
    std::__detail::__variant::
    _Variant_storage<false,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
    ::~_Variant_storage((_Variant_storage<false,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                         *)local_78);
    return __return_storage_ptr__;
  }
  visit((Flow *)local_78,this,curr->ref);
  if (CONCAT44(flow.breakTo.super_IString.str._M_len._4_4_,
               (undefined4)flow.breakTo.super_IString.str._M_len) == 0) {
    if (((long)((long)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_start -
               flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3) *
        -0x5555555555555555 + (long)local_78 != 1) {
      __assert_fail("values.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                    ,0x43,"const Literal &wasm::Flow::getSingleValue()");
    }
    if (curr->op == BrOnNull) {
      bVar2 = Literal::isNull((Literal *)&flow);
      if (bVar2) {
        flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (undefined4)(curr->name).super_IString.str._M_len;
        flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             *(undefined4 *)((long)&(curr->name).super_IString.str._M_len + 4);
        flow.breakTo.super_IString.str._M_len._0_4_ =
             *(undefined4 *)&(curr->name).super_IString.str._M_str;
        flow.breakTo.super_IString.str._M_len._4_4_ =
             *(undefined4 *)((long)&(curr->name).super_IString.str._M_str + 4);
        *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.
                          fixed._M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        type.id = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        field_0.i64 = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        goto LAB_005fbc95;
      }
      Literal::Literal(&local_a8,(Literal *)&flow);
      Flow::Flow(__return_storage_ptr__,&local_a8);
      pLVar3 = &local_a8;
    }
    else {
      bVar2 = Literal::isNull((Literal *)&flow);
      if (bVar2) {
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.
                          fixed._M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        type.id = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        field_0.i64 = 0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        goto LAB_005fbe6c;
      }
      sVar1 = (curr->name).super_IString.str;
      Literal::Literal(&local_90,(Literal *)&flow);
      Flow::Flow(__return_storage_ptr__,(Name)sVar1,&local_90);
      pLVar3 = &local_90;
    }
    Literal::~Literal(pLVar3);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_78;
    Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                     _M_elems,(Literal *)&flow);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
LAB_005fbc95:
    *(undefined4 *)&(__return_storage_ptr__->breakTo).super_IString.str._M_len =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->breakTo).super_IString.str._M_len + 4) =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (undefined4)flow.breakTo.super_IString.str._M_len;
    *(undefined4 *)((long)&(__return_storage_ptr__->breakTo).super_IString.str._M_str + 4) =
         flow.breakTo.super_IString.str._M_len._4_4_;
  }
LAB_005fbe6c:
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  Literal::~Literal((Literal *)&flow);
  return __return_storage_ptr__;
}

Assistant:

Flow visitBrOn(BrOn* curr) {
    NOTE_ENTER("BrOn");
    // BrOnCast* uses the casting infrastructure, so handle them first.
    if (curr->op == BrOnCast || curr->op == BrOnCastFail) {
      auto cast = doCast(curr);
      if (auto* breaking = cast.getBreaking()) {
        return *breaking;
      } else if (auto* original = cast.getFailure()) {
        if (curr->op == BrOnCast) {
          return *original;
        } else {
          return Flow(curr->name, *original);
        }
      } else {
        auto* result = cast.getSuccess();
        assert(result);
        if (curr->op == BrOnCast) {
          return Flow(curr->name, *result);
        } else {
          return *result;
        }
      }
    }
    // Otherwise we are just checking for null.
    Flow flow = visit(curr->ref);
    if (flow.breaking()) {
      return flow;
    }
    const auto& value = flow.getSingleValue();
    NOTE_EVAL1(value);
    if (curr->op == BrOnNull) {
      // BrOnNull does not propagate the value if it takes the branch.
      if (value.isNull()) {
        return Flow(curr->name);
      }
      // If the branch is not taken, we return the non-null value.
      return {value};
    } else {
      // BrOnNonNull does not return a value if it does not take the branch.
      if (value.isNull()) {
        return Flow();
      }
      // If the branch is taken, we send the non-null value.
      return Flow(curr->name, value);
    }
  }